

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
::_update_barcode(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
                  *this,Pos_index birth)

{
  Pos_index PVar1;
  Bar_dictionary *this_00;
  mapped_type *this_01;
  Pos_index *pPVar2;
  pointer pPVar3;
  unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
  *this_02;
  mapped_type *barIt;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
  *pCStack_10;
  Pos_index birth_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_true>_>_>
  *this_local;
  
  barIt._4_4_ = birth;
  pCStack_10 = this;
  this_00 = _indexToBar(this);
  this_01 = std::
            unordered_map<unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>_>
            ::at(this_00,(key_type *)((long)&barIt + 4));
  pPVar2 = _nextPosition(this);
  PVar1 = *pPVar2;
  pPVar3 = std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
           ::operator->(this_01);
  pPVar3->death = PVar1;
  this_02 = (unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
             *)_indexToBar(this);
  pPVar2 = _nextPosition(this);
  std::
  unordered_map<unsigned_int,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>>
  ::
  try_emplace<std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            (this_02,pPVar2,this_01);
  pPVar2 = _nextPosition(this);
  *pPVar2 = *pPVar2 + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_update_barcode(Pos_index birth)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      auto& barIt = _indexToBar().at(birth);
      barIt->death = _nextPosition();
      _indexToBar().try_emplace(_nextPosition(), barIt);  // list so iterators are stable
    } else {
      _barcode()[_indexToBar()[birth]].death = _nextPosition();
      _indexToBar().push_back(_indexToBar()[birth]);
    }
    ++_nextPosition();
  }
}